

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void computeLimitRegisters(Parse *pParse,Select *p,int iBreak)

{
  byte *pbVar1;
  Expr *pEVar2;
  long lVar3;
  LogEst LVar4;
  int iVar5;
  long in_RAX;
  Vdbe *p_00;
  int target;
  int iVar6;
  ulong x;
  int n;
  undefined8 local_38;
  
  pEVar2 = p->pLimit;
  if (pEVar2 == (Expr *)0x0 || p->iLimit != 0) {
    return;
  }
  target = pParse->nMem + 1;
  pParse->nMem = target;
  p->iLimit = target;
  local_38 = in_RAX;
  p_00 = sqlite3GetVdbe(pParse);
  iVar5 = sqlite3ExprIsInteger(pEVar2->pLeft,(int *)((long)&local_38 + 4));
  lVar3 = local_38;
  if (iVar5 == 0) {
    sqlite3ExprCode(pParse,pEVar2->pLeft,target);
    sqlite3VdbeAddOp3(p_00,0xc,target,0,0);
    iVar6 = 0x10;
    iVar5 = target;
  }
  else {
    local_38 = CONCAT44(local_38._4_4_,iBreak);
    x = (ulong)local_38._4_4_;
    sqlite3VdbeAddOp3(p_00,0x47,local_38._4_4_,target,0);
    if (x != 0) {
      if (-1 < lVar3) {
        local_38 = CONCAT62(local_38._2_6_,p->nSelectRow);
        LVar4 = sqlite3LogEst(x);
        if (LVar4 < (short)local_38) {
          LVar4 = sqlite3LogEst(x);
          p->nSelectRow = LVar4;
          pbVar1 = (byte *)((long)&p->selFlags + 1);
          *pbVar1 = *pbVar1 | 0x40;
        }
      }
      goto LAB_00178357;
    }
    iVar6 = 8;
    iVar5 = 0;
    iBreak = (int)local_38;
  }
  sqlite3VdbeAddOp3(p_00,iVar6,iVar5,iBreak,0);
LAB_00178357:
  pEVar2 = pEVar2->pRight;
  if (pEVar2 == (Expr *)0x0) {
    return;
  }
  iVar6 = pParse->nMem;
  iVar5 = iVar6 + 1;
  pParse->nMem = iVar5;
  p->iOffset = iVar5;
  iVar6 = iVar6 + 2;
  pParse->nMem = iVar6;
  sqlite3ExprCode(pParse,pEVar2,iVar5);
  sqlite3VdbeAddOp3(p_00,0xc,iVar5,0,0);
  sqlite3VdbeAddOp3(p_00,0xa0,target,iVar6,iVar5);
  return;
}

Assistant:

static void computeLimitRegisters(Parse *pParse, Select *p, int iBreak){
  Vdbe *v = 0;
  int iLimit = 0;
  int iOffset;
  int n;
  Expr *pLimit = p->pLimit;

  if( p->iLimit ) return;

  /*
  ** "LIMIT -1" always shows all rows.  There is some
  ** controversy about what the correct behavior should be.
  ** The current implementation interprets "LIMIT 0" to mean
  ** no rows.
  */
  if( pLimit ){
    assert( pLimit->op==TK_LIMIT );
    assert( pLimit->pLeft!=0 );
    p->iLimit = iLimit = ++pParse->nMem;
    v = sqlite3GetVdbe(pParse);
    assert( v!=0 );
    if( sqlite3ExprIsInteger(pLimit->pLeft, &n) ){
      sqlite3VdbeAddOp2(v, OP_Integer, n, iLimit);
      VdbeComment((v, "LIMIT counter"));
      if( n==0 ){
        sqlite3VdbeGoto(v, iBreak);
      }else if( n>=0 && p->nSelectRow>sqlite3LogEst((u64)n) ){
        p->nSelectRow = sqlite3LogEst((u64)n);
        p->selFlags |= SF_FixedLimit;
      }
    }else{
      sqlite3ExprCode(pParse, pLimit->pLeft, iLimit);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iLimit); VdbeCoverage(v);
      VdbeComment((v, "LIMIT counter"));
      sqlite3VdbeAddOp2(v, OP_IfNot, iLimit, iBreak); VdbeCoverage(v);
    }
    if( pLimit->pRight ){
      p->iOffset = iOffset = ++pParse->nMem;
      pParse->nMem++;   /* Allocate an extra register for limit+offset */
      sqlite3ExprCode(pParse, pLimit->pRight, iOffset);
      sqlite3VdbeAddOp1(v, OP_MustBeInt, iOffset); VdbeCoverage(v);
      VdbeComment((v, "OFFSET counter"));
      sqlite3VdbeAddOp3(v, OP_OffsetLimit, iLimit, iOffset+1, iOffset);
      VdbeComment((v, "LIMIT+OFFSET"));
    }
  }
}